

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  anon_struct_4_5_613047fb_for_header *paVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  this->merges = this->merges + 1;
  paVar1 = &_qs->header;
  if ((uint)_ps->header >> 5 < (uint)_qs->header >> 5) {
    paVar1 = &_ps->header;
    _ps = _qs;
  }
  *size = ((uint)_ps->header >> 5) - 1;
  bVar6 = (uint)*paVar1 < 0x20;
  if (!bVar6) {
    uVar4 = 0;
    do {
      iVar2 = (int)paVar1[uVar4 + 1] >> 1;
      if (iVar2 != v) {
        uVar3 = 5;
        if (0x1f < (uint)_ps->header) {
          uVar5 = 0;
          do {
            if ((int)(&_ps->header)[uVar5 + 1] >> 1 == iVar2) {
              uVar3 = (uint)(&_ps->header)[uVar5 + 1] ^ (uint)paVar1[uVar4 + 1];
              if (uVar3 != 1) {
                uVar3 = 8;
              }
              break;
            }
            uVar5 = uVar5 + 1;
          } while ((uint)_ps->header >> 5 != uVar5);
        }
        if (uVar3 != 8) {
          if (uVar3 != 5) {
            return bVar6;
          }
          *size = *size + 1;
        }
      }
      uVar4 = uVar4 + 1;
      bVar7 = uVar4 < (uint)*paVar1 >> 5;
      bVar6 = !bVar7;
    } while (bVar7);
  }
  return bVar6;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, int& size)
{
    merges++;

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;
    const Lit*  __ps  = (const Lit*)ps;
    const Lit*  __qs  = (const Lit*)qs;

    size = ps.size()-1;

    for (int i = 0; i < qs.size(); i++){
        if (var(__qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(__ps[j]) == var(__qs[i])){
                    if (__ps[j] == ~__qs[i])
                        return false;
                    else
                        goto next;
                }
            size++;
        }
        next:;
    }

    return true;
}